

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O1

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
indk::NeuralNet::doSignalReceive
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,NeuralNet *this,string *ensemble)

{
  pointer pbVar1;
  pointer pcVar2;
  size_t sVar3;
  long *__s1;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar7;
  pointer pbVar8;
  pointer pbVar9;
  pointer pbVar10;
  long lVar11;
  pointer pbVar12;
  pointer __k;
  pair<long,_float> pVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elist;
  long *local_110;
  float local_108;
  undefined4 uStack_104;
  long local_100 [2];
  pointer local_f0;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_88;
  long local_80;
  long local_78 [2];
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  _Base_ptr local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *local_38;
  
  local_68.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((ensemble->_M_string_length == 0) ||
     ((iVar5 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::find(&(this->Ensembles)._M_t,ensemble), pvVar7 = __return_storage_ptr__,
      (_Rb_tree_header *)iVar5._M_node != &(this->Ensembles)._M_t._M_impl.super__Rb_tree_header &&
      (std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator=(&local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(iVar5._M_node + 2)),
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)))) {
    __k = (this->Outputs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = __return_storage_ptr__;
    if (__k != pbVar1) {
      local_38 = &this->Neurons;
      do {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                ::find(&local_38->_M_t,__k);
        pbVar8 = local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((_Rb_tree_header *)iVar6._M_node != &(this->Neurons)._M_t._M_impl.super__Rb_tree_header)
        {
          local_f0 = local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar2 = (__k->_M_dataplus)._M_p;
            local_e8 = local_d8;
            local_40 = iVar6._M_node;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,pcVar2,pcVar2 + __k->_M_string_length);
            local_c8 = local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_e8,local_e0 + (long)local_e8);
            local_110 = local_100;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,local_c8,local_c0 + (long)local_c8);
            local_88 = local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,local_110,
                       CONCAT44(uStack_104,local_108) + (long)local_110);
            if (local_110 != local_100) {
              operator_delete(local_110,local_100[0] + 1);
            }
            local_110 = local_100;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,local_88,local_80 + (long)local_88);
            __s1 = local_110;
            lVar11 = (long)local_f0 - (long)pbVar8 >> 7;
            pbVar9 = pbVar8;
            if (0 < lVar11) {
              pbVar9 = (pointer)((long)&(pbVar8->_M_dataplus)._M_p +
                                ((long)local_f0 - (long)pbVar8 & 0xffffffffffffff80U));
              sVar3 = CONCAT44(uStack_104,local_108);
              lVar11 = lVar11 + 1;
              pbVar12 = pbVar8 + 2;
              do {
                if (sVar3 == pbVar12[-2]._M_string_length) {
                  if (sVar3 == 0) {
                    pbVar10 = pbVar12 + -2;
                    goto LAB_00118624;
                  }
                  iVar4 = bcmp(__s1,pbVar12[-2]._M_dataplus._M_p,sVar3);
                  pbVar10 = pbVar8;
                  if (iVar4 == 0) goto LAB_00118624;
                }
                if (sVar3 == pbVar12[-1]._M_string_length) {
                  if (sVar3 == 0) {
                    pbVar10 = pbVar8 + 1;
                    goto LAB_00118624;
                  }
                  iVar4 = bcmp(__s1,pbVar12[-1]._M_dataplus._M_p,sVar3);
                  if (iVar4 == 0) {
                    pbVar10 = pbVar12 + -1;
                    goto LAB_00118624;
                  }
                }
                if (sVar3 == pbVar12->_M_string_length) {
                  pbVar10 = pbVar12;
                  if (sVar3 == 0) goto LAB_00118624;
                  iVar4 = bcmp(__s1,(pbVar12->_M_dataplus)._M_p,sVar3);
                  if (iVar4 == 0) {
                    pbVar10 = pbVar8 + 2;
                    goto LAB_00118624;
                  }
                }
                if (sVar3 == pbVar12[1]._M_string_length) {
                  if (sVar3 == 0) {
                    pbVar10 = pbVar8 + 3;
                    goto LAB_00118624;
                  }
                  iVar4 = bcmp(__s1,pbVar12[1]._M_dataplus._M_p,sVar3);
                  if (iVar4 == 0) {
                    pbVar10 = pbVar12 + 1;
                    goto LAB_00118624;
                  }
                }
                pbVar8 = pbVar8 + 4;
                lVar11 = lVar11 + -1;
                pbVar12 = pbVar12 + 4;
              } while (1 < lVar11);
            }
            lVar11 = (long)local_f0 - (long)pbVar9 >> 5;
            if (lVar11 == 1) {
LAB_001185b8:
              sVar3 = CONCAT44(uStack_104,local_108);
              pbVar10 = local_f0;
              if (((sVar3 == pbVar9->_M_string_length) && (pbVar10 = pbVar9, sVar3 != 0)) &&
                 (iVar4 = bcmp(local_110,(pbVar9->_M_dataplus)._M_p,sVar3), iVar4 != 0)) {
                pbVar10 = local_f0;
              }
            }
            else if (lVar11 == 2) {
LAB_0011858e:
              sVar3 = CONCAT44(uStack_104,local_108);
              if ((sVar3 != pbVar9->_M_string_length) ||
                 ((pbVar10 = pbVar9, sVar3 != 0 &&
                  (iVar4 = bcmp(local_110,(pbVar9->_M_dataplus)._M_p,sVar3), iVar4 != 0)))) {
                pbVar9 = pbVar9 + 1;
                goto LAB_001185b8;
              }
            }
            else {
              pbVar10 = local_f0;
              if ((lVar11 == 3) &&
                 ((sVar3 = CONCAT44(uStack_104,local_108), sVar3 != pbVar9->_M_string_length ||
                  ((pbVar10 = pbVar9, sVar3 != 0 &&
                   (iVar4 = bcmp(local_110,(pbVar9->_M_dataplus)._M_p,sVar3), iVar4 != 0)))))) {
                pbVar9 = pbVar9 + 1;
                goto LAB_0011858e;
              }
            }
LAB_00118624:
            if (local_110 != local_100) {
              operator_delete(local_110,local_100[0] + 1);
            }
            if (local_88 != local_78) {
              operator_delete(local_88,local_78[0] + 1);
            }
            if (local_c8 != local_b8) {
              operator_delete(local_c8,local_b8[0] + 1);
            }
            if (local_e8 != local_d8) {
              operator_delete(local_e8,local_d8[0] + 1);
            }
            iVar6._M_node = local_40;
            if (pbVar10 ==
                local_a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001186d5;
          }
          pVar13 = Neuron::doSignalReceive(*(Neuron **)(iVar6._M_node + 2),-1);
          local_108 = pVar13.second;
          local_110 = (long *)pVar13.first;
          std::
          vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
          ::emplace_back<float,std::__cxx11::string_const&>
                    ((vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
                      *)&local_68,&local_108,__k);
        }
LAB_001186d5:
        __k = __k + 1;
      } while (__k != pbVar1);
    }
    __return_storage_ptr__ = &local_68;
    (local_48->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_48->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_48->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar7 = local_48;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_68);
  return pvVar7;
}

Assistant:

std::vector<indk::OutputValue> indk::NeuralNet::doSignalReceive(const std::string& ensemble) {
    std::vector<indk::OutputValue> ny;
    std::vector<std::string> elist;

    if (!ensemble.empty()) {
        auto en = Ensembles.find(ensemble);
        if (en == Ensembles.end()) return {};
        elist = en -> second;
        if (elist.empty()) return {};
    }

    for (const auto& oname: Outputs) {
        auto n = Neurons.find(oname);
        if (n != Neurons.end()) {
            if (!elist.empty()) {
                auto item = std::find_if(elist.begin(), elist.end(), [oname](const std::string &value) {
                    return oname == value;
                });
                if (item == elist.end()) continue;
            }

            ny.emplace_back(n->second->doSignalReceive().second, oname);
        }
    }
    return ny;
}